

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

BOOL __thiscall
Js::HeapArgumentsObject::GetItemAt
          (HeapArgumentsObject *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  BOOL BVar1;
  Var pvVar2;
  
  BVar1 = HasItemAt(this,index);
  if (BVar1 != 0) {
    pvVar2 = DynamicObject::GetSlot(&((this->frameObject).ptr)->super_DynamicObject,index);
    *value = pvVar2;
  }
  return (uint)(BVar1 != 0);
}

Assistant:

BOOL HeapArgumentsObject::GetItemAt(uint32 index, Var* value, ScriptContext* requestContext)
    {
        // If this arg index is bound to a named formal argument, get it from the local frame.
        // If not, report this fact to the caller, which will defer to the normal get-value-by-index means.
        if (HasItemAt(index))
        {
            *value = this->frameObject->GetSlot(index);
            return true;
        }

        return false;
    }